

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O2

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::postCorrelate
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this)

{
  Vector<double,_4U> *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __denom;
  Vector<double,_4U> *pVVar1;
  uint i;
  ulong uVar2;
  long lVar3;
  Vector<double,_4U> zeroType;
  undefined1 local_48 [40];
  
  pVVar1 = (Vector<double,_4U> *)local_48;
  local_48._0_8_ = 0.0;
  this_00 = (Vector<double,_4U> *)(local_48 + 8);
  Vector<double,_4U>::Vector(this_00,(double *)local_48);
  lVar3 = 0;
  __denom = extraout_EDX;
  for (uVar2 = 0; uVar2 < this->nTimeBins_; uVar2 = uVar2 + 1) {
    if ((this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar2] < 1) {
      pVVar1 = this_00;
      Vector<double,_4U>::operator=
                ((Vector<double,_4U> *)
                 ((long)((this->histogram_).
                         super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_ + lVar3),this_00);
      __denom = extraout_EDX_01;
    }
    else {
      Vector<double,_4U>::div
                ((Vector<double,_4U> *)
                 ((long)((this->histogram_).
                         super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->data_ + lVar3),(int)pVVar1,
                 __denom);
      __denom = extraout_EDX_00;
    }
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::postCorrelate() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = zeroType;
      }
    }
  }